

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::ruby::RubifyConstant_abi_cxx11_
          (string *__return_storage_ptr__,ruby *this,string_view name)

{
  bool bVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  AlphaNum local_b8;
  AlphaNum local_88;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string ret;
  string_view name_local;
  
  ret.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_40,
             (basic_string_view<char,_std::char_traits<char>_> *)((long)&ret.field_2 + 8),&local_41)
  ;
  std::allocator<char>::~allocator(&local_41);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
    bVar1 = IsLower(*pcVar4);
    if (bVar1) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      cVar2 = UpperChar(*pcVar4);
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      *pcVar4 = cVar2;
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      bVar1 = IsAlpha(*pcVar4);
      if (!bVar1) {
        absl::lts_20240722::AlphaNum::AlphaNum(&local_88,"PB_");
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
                  (&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_88);
        goto LAB_004f732f;
      }
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
LAB_004f732f:
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string RubifyConstant(absl::string_view name) {
  std::string ret(name);
  if (!ret.empty()) {
    if (IsLower(ret[0])) {
      // If it starts with a lowercase letter, capitalize it.
      ret[0] = UpperChar(ret[0]);
    } else if (!IsAlpha(ret[0])) {
      // Otherwise (e.g. if it begins with an underscore), we need to come up
      // with some prefix that starts with a capital letter. We could be smarter
      // here, e.g. try to strip leading underscores, but this may cause other
      // problems if the user really intended the name. So let's just prepend a
      // well-known suffix.
      return absl::StrCat("PB_", ret);
    }
  }

  return ret;
}